

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O0

FT_Error T42_GlyphSlot_Init(FT_GlyphSlot t42slot)

{
  FT_Memory memory_00;
  FT_Error local_3c;
  FT_Error error;
  FT_Memory memory;
  FT_GlyphSlot ttslot;
  T42_Face t42face;
  FT_Face face;
  T42_GlyphSlot slot;
  FT_GlyphSlot t42slot_local;
  
  ttslot = (FT_GlyphSlot)t42slot->face;
  memory_00 = (((T42_Face)ttslot)->root).memory;
  local_3c = 0;
  t42face = (T42_Face)ttslot;
  face = (FT_Face)t42slot;
  slot = (T42_GlyphSlot)t42slot;
  if (*(FT_GlyphSlot *)&(((T42_Face)ttslot)->root).glyph == (FT_GlyphSlot)0x0) {
    t42slot[1].library = (FT_Library)((T42_Face)ttslot)->ttf_face->glyph;
  }
  else {
    local_3c = FT_New_GlyphSlot(((T42_Face)ttslot)->ttf_face,(FT_GlyphSlot *)&memory);
    if (local_3c == 0) {
      *(FT_Memory *)&face[1].num_fixed_sizes = memory;
    }
  }
  FT_GlyphLoader_Done((FT_GlyphLoader)**(undefined8 **)(*(long *)&face[1].num_fixed_sizes + 0x128));
  ft_mem_free(memory_00,*(void **)(*(long *)&face[1].num_fixed_sizes + 0x128));
  *(undefined8 *)(*(long *)&face[1].num_fixed_sizes + 0x128) = 0;
  *(FT_Slot_Internal *)(*(long *)&face[1].num_fixed_sizes + 0x128) = (slot->root).internal;
  return local_3c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_GlyphSlot_Init( FT_GlyphSlot  t42slot )        /* T42_GlyphSlot */
  {
    T42_GlyphSlot  slot    = (T42_GlyphSlot)t42slot;
    FT_Face        face    = t42slot->face;
    T42_Face       t42face = (T42_Face)face;
    FT_GlyphSlot   ttslot;
    FT_Memory      memory  = face->memory;
    FT_Error       error   = FT_Err_Ok;


    if ( !face->glyph )
    {
      /* First glyph slot for this face */
      slot->ttslot = t42face->ttf_face->glyph;
    }
    else
    {
      error = FT_New_GlyphSlot( t42face->ttf_face, &ttslot );
      if ( !error )
        slot->ttslot = ttslot;
    }

    /* share the loader so that the autohinter can see it */
    FT_GlyphLoader_Done( slot->ttslot->internal->loader );
    FT_FREE( slot->ttslot->internal );
    slot->ttslot->internal = t42slot->internal;

    return error;
  }